

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cpp
# Opt level: O2

void __thiscall pfederc::StringToken::~StringToken(StringToken *this)

{
  ~StringToken(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

StringToken::~StringToken() {
}